

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abin.c
# Opt level: O3

void addBBox2BBox(region *abb,region *bb)

{
  double *pdVar1;
  double dVar2;
  
  dVar2 = (abb->min).x;
  if (dVar2 < (bb->min).x) {
    (bb->min).x = dVar2;
  }
  dVar2 = (abb->min).y;
  if (dVar2 < (bb->min).y) {
    (bb->min).y = dVar2;
  }
  dVar2 = (abb->min).z;
  if (dVar2 < (bb->min).z) {
    (bb->min).z = dVar2;
  }
  dVar2 = (abb->max).x;
  if ((bb->max).x <= dVar2 && dVar2 != (bb->max).x) {
    (bb->max).x = dVar2;
  }
  dVar2 = (abb->max).y;
  pdVar1 = &(bb->max).y;
  if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
    (bb->max).y = dVar2;
  }
  dVar2 = (abb->max).z;
  pdVar1 = &(bb->max).z;
  if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
    (bb->max).z = dVar2;
  }
  return;
}

Assistant:

void addBBox2BBox(region *abb, region *bb) {
	if (abb->min.x < bb->min.x) {bb->min.x = abb->min.x;}
	if (abb->min.y < bb->min.y) {bb->min.y = abb->min.y;}
	if (abb->min.z < bb->min.z) {bb->min.z = abb->min.z;}

	if (abb->max.x > bb->max.x) {bb->max.x = abb->max.x;}
	if (abb->max.y > bb->max.y) {bb->max.y = abb->max.y;}
	if (abb->max.z > bb->max.z) {bb->max.z = abb->max.z;}
}